

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::setClearButtonEnabled(QLineEdit *this,bool enable)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QAnyStringView aName;
  byte bVar1;
  bool bVar2;
  QFlagsStorage<Qt::FindChildOption> options;
  QLineEditPrivate *action;
  QAnyStringView *this_00;
  QWidget *pQVar3;
  QAction *pQVar4;
  byte in_SIL;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QAction *clearAction_1;
  QWidget *widgetAction;
  int flags;
  QAction *clearAction;
  QLineEditPrivate *d;
  undefined8 in_stack_ffffffffffffff08;
  FindChildOption flags_00;
  QObject *in_stack_ffffffffffffff10;
  QAnyStringView *in_stack_ffffffffffffff18;
  QAnyStringView *this_01;
  QLineEditPrivate *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffffb0;
  ActionPosition in_stack_ffffffffffffffb4;
  QAction *in_stack_ffffffffffffffb8;
  QAction *in_stack_ffffffffffffffc0;
  QLineEditPrivate *in_stack_ffffffffffffffc8;
  undefined1 local_28 [24];
  QIcon local_10;
  long local_8;
  
  flags_00 = (FindChildOption)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  action = d_func((QLineEdit *)0x5c3c69);
  options.i = (Int)(bVar1 & 1);
  bVar2 = isClearButtonEnabled((QLineEdit *)in_stack_ffffffffffffff10);
  if (options.i != bVar2) {
    if ((bVar1 & 1) == 0) {
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
      str_00.m_data = in_stack_ffffffffffffff28;
      str_00.m_size = (qsizetype)in_stack_ffffffffffffff20;
      QAnyStringView::QAnyStringView(in_stack_ffffffffffffff18,str_00);
      QFlags<Qt::FindChildOption>::QFlags
                ((QFlags<Qt::FindChildOption> *)in_stack_ffffffffffffff10,flags_00);
      aName.m_size = in_stack_ffffffffffffff48;
      aName.field_0.m_data = in_stack_ffffffffffffff40.m_data;
      pQVar4 = QObject::findChild<QAction*>
                         (in_stack_ffffffffffffff10,aName,(FindChildOptions)options.i);
      QLineEditPrivate::removeAction
                ((QLineEditPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffff68),(QAction *)action);
      if (pQVar4 != (QAction *)0x0) {
        (**(code **)(*(long *)pQVar4 + 0x20))();
      }
    }
    else {
      this_00 = (QAnyStringView *)operator_new(0x10);
      QLineEditPrivate::clearButtonIcon(in_stack_ffffffffffffff20);
      QString::QString((QString *)0x5c3cd3);
      QAction::QAction((QAction *)this_00,(QIcon *)&local_10,(QString *)local_28,in_RDI);
      QString::~QString((QString *)0x5c3cff);
      QIcon::~QIcon(&local_10);
      this_01 = this_00;
      isReadOnly((QLineEdit *)this_00);
      QAction::setEnabled(SUB81(this_01,0));
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)this_01);
      str.m_data = in_stack_ffffffffffffff28;
      str.m_size = (qsizetype)this_00;
      QAnyStringView::QAnyStringView(this_01,str);
      QObject::setObjectName((QAnyStringView *)this_00);
      pQVar3 = QLineEditPrivate::addAction
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                          in_stack_ffffffffffffffb0);
      text((QLineEdit *)this_01);
      bVar2 = QString::isEmpty((QString *)0x5c3de4);
      (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,(bVar2 ^ 0xffU) & 1);
      QString::~QString((QString *)0x5c3e0a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::setClearButtonEnabled(bool enable)
{
#if QT_CONFIG(action)
    Q_D(QLineEdit);
    if (enable == isClearButtonEnabled())
        return;
    if (enable) {
        QAction *clearAction = new QAction(d->clearButtonIcon(), QString(), this);
        clearAction->setEnabled(!isReadOnly());
        clearAction->setObjectName(QLatin1StringView(clearButtonActionNameC));

        int flags = QLineEditPrivate::SideWidgetClearButton | QLineEditPrivate::SideWidgetFadeInWithText;
        auto widgetAction = d->addAction(clearAction, nullptr, QLineEdit::TrailingPosition, flags);
        widgetAction->setVisible(!text().isEmpty());
    } else {
        QAction *clearAction = findChild<QAction *>(QLatin1StringView(clearButtonActionNameC));
        Q_ASSERT(clearAction);
        d->removeAction(clearAction);
        delete clearAction;
    }
#else
    Q_UNUSED(enable);
#endif // QT_CONFIG(action)
}